

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O3

void pnga_scan_copy(Integer g_src,Integer g_dst,Integer g_msk,Integer lo,Integer hi)

{
  long *plVar1;
  undefined4 *puVar2;
  float fVar3;
  double dVar4;
  long lVar5;
  void *pvVar6;
  Integer nelem;
  Integer IVar7;
  logical lVar8;
  void *__s;
  double *pdVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  Integer rmt_idx;
  int last_val;
  void *ptr_msk;
  void *ptr_dst;
  void *ptr_src;
  Integer ld;
  Integer lop;
  Integer hip;
  Integer type_msk;
  Integer type_src;
  Integer type_dst;
  Integer dims;
  Integer ndim;
  Integer local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  long local_b0;
  Integer local_a8;
  Integer local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  Integer local_80;
  ulong local_78;
  void *local_70;
  void *local_68;
  Integer local_60;
  long local_58;
  long local_50;
  long local_48;
  Integer local_40;
  long local_38;
  
  local_88 = 0;
  local_90 = 0;
  local_b0 = 0;
  local_98 = lo;
  local_68 = (void *)hi;
  nelem = pnga_nnodes();
  IVar7 = pnga_nodeid();
  pnga_check_handle(g_src,"ga_scan_copy 1");
  pnga_check_handle(g_dst,"ga_scan_copy 2");
  pnga_check_handle(g_msk,"ga_scan_copy 3");
  lVar8 = pnga_compare_distr(g_src,g_msk);
  if (lVar8 == 0) {
    pnga_error("ga_scan_copy: different distribution src",0);
  }
  local_a8 = IVar7;
  lVar8 = pnga_compare_distr(g_dst,g_msk);
  if (lVar8 == 0) {
    pnga_error("ga_scan_copy: different distribution dst",0);
  }
  pnga_inquire(g_src,&local_50,&local_38,&local_40);
  local_60 = g_dst;
  pnga_inquire(g_dst,&local_48,&local_38,&local_40);
  pnga_inquire(g_msk,&local_58,&local_38,&local_40);
  if (1 < local_38) {
    pnga_error("ga_scan_copy: applicable to 1-dim arrays",local_38);
  }
  IVar7 = local_a8;
  local_a0 = g_src;
  if (g_src == local_60) {
    pnga_error("ga_scan_copy: src and dst must be different arrays",0);
  }
  if (local_50 != local_48) {
    pnga_error("ga_scan_copy: src and dst arrays must be same type",0);
  }
  pnga_sync();
  pnga_distribution(g_msk,IVar7,(Integer *)&local_78,(Integer *)&local_70);
  __s = pnga_malloc(nelem,0x3ea,"ga scan buf");
  memset(__s,0,nelem * 8);
  pvVar6 = local_70;
  uVar11 = local_78;
  *(undefined8 *)((long)__s + IVar7 * 8) = 0xffffffffffffffff;
  if (0 < (long)local_78) {
    pnga_access_ptr(g_msk,(Integer *)&local_78,(Integer *)&local_70,&local_b0,&local_80);
    if (local_58 - 0x3e9U < 0x10) {
      lVar15 = (long)pvVar6 - uVar11;
      switch(local_58) {
      case 0x3e9:
        if (-1 < lVar15) {
          lVar10 = 0;
          do {
            if ((*(int *)(local_b0 + lVar10 * 4) != 0) &&
               (lVar13 = local_78 + lVar10, lVar13 <= (long)local_68 && (long)local_98 <= lVar13)) {
              *(long *)((long)__s + IVar7 * 8) = lVar13;
            }
            lVar10 = lVar10 + 1;
          } while (lVar15 + 1 != lVar10);
        }
        break;
      case 0x3ea:
        if (-1 < lVar15) {
          lVar10 = 0;
          do {
            if ((*(long *)(local_b0 + lVar10 * 8) != 0) &&
               (lVar13 = local_78 + lVar10, lVar13 <= (long)local_68 && (long)local_98 <= lVar13)) {
              *(long *)((long)__s + IVar7 * 8) = lVar13;
            }
            lVar10 = lVar10 + 1;
          } while (lVar15 + 1 != lVar10);
        }
        break;
      case 0x3eb:
        if (-1 < lVar15) {
          lVar10 = 0;
          do {
            fVar3 = *(float *)(local_b0 + lVar10 * 4);
            if (((fVar3 != 0.0) || (NAN(fVar3))) &&
               (lVar13 = local_78 + lVar10, lVar13 <= (long)local_68 && (long)local_98 <= lVar13)) {
              *(long *)((long)__s + IVar7 * 8) = lVar13;
            }
            lVar10 = lVar10 + 1;
          } while (lVar15 + 1 != lVar10);
        }
        break;
      case 0x3ec:
        if (-1 < lVar15) {
          lVar10 = 0;
          do {
            dVar4 = *(double *)(local_b0 + lVar10 * 8);
            if (((dVar4 != 0.0) || (NAN(dVar4))) &&
               (lVar13 = local_78 + lVar10, lVar13 <= (long)local_68 && (long)local_98 <= lVar13)) {
              *(long *)((long)__s + IVar7 * 8) = lVar13;
            }
            lVar10 = lVar10 + 1;
          } while (lVar15 + 1 != lVar10);
        }
        break;
      case 0x3ee:
        if (-1 < lVar15) {
          lVar10 = 0;
          do {
            fVar3 = *(float *)(local_b0 + lVar10 * 8);
            if ((((fVar3 != 0.0) || (NAN(fVar3))) ||
                ((fVar3 = *(float *)(local_b0 + 4 + lVar10 * 8), fVar3 != 0.0 || (NAN(fVar3))))) &&
               (lVar13 = local_78 + lVar10, lVar13 <= (long)local_68 && (long)local_98 <= lVar13)) {
              *(long *)((long)__s + IVar7 * 8) = lVar13;
            }
            lVar10 = lVar10 + 1;
          } while (lVar15 + 1 != lVar10);
        }
        break;
      case 0x3ef:
        if (-1 < lVar15) {
          pdVar9 = (double *)(local_b0 + 8);
          lVar10 = 0;
          do {
            if (((((pdVar9[-1] != 0.0) || (NAN(pdVar9[-1]))) || (*pdVar9 != 0.0)) || (NAN(*pdVar9)))
               && (lVar13 = local_78 + lVar10, lVar13 <= (long)local_68 && (long)local_98 <= lVar13)
               ) {
              *(long *)((long)__s + IVar7 * 8) = lVar13;
            }
            lVar10 = lVar10 + 1;
            pdVar9 = pdVar9 + 2;
          } while (lVar15 + 1 != lVar10);
        }
        break;
      case 0x3f8:
        if (-1 < lVar15) {
          lVar10 = 0;
          do {
            if ((*(long *)(local_b0 + lVar10 * 8) != 0) &&
               (lVar13 = local_78 + lVar10, lVar13 <= (long)local_68 && (long)local_98 <= lVar13)) {
              *(long *)((long)__s + IVar7 * 8) = lVar13;
            }
            lVar10 = lVar10 + 1;
          } while (lVar15 + 1 != lVar10);
        }
      }
    }
    pnga_release(g_msk,(Integer *)&local_78,(Integer *)&local_70);
  }
  pnga_gop(0x3ea,__s,nelem,"+");
  if ((long)local_70 < (long)local_98 || (long)local_68 < (long)local_78) goto LAB_00138683;
  local_a8 = 0;
  if (local_98 - local_78 != 0 && (long)local_78 <= (long)local_98) {
    local_a8 = local_98 - local_78;
  }
  if ((long)local_70 < (long)local_68) {
    local_68 = local_70;
  }
  local_d0 = -1;
  if (0 < nelem) {
    lVar15 = -1;
    lVar10 = 0;
    do {
      lVar13 = *(long *)((long)__s + lVar10 * 8);
      if (((lVar13 < (long)local_78) && (lVar13 != -1)) && (lVar15 < lVar13)) {
        lVar15 = lVar13;
        local_d0 = lVar13;
      }
      lVar10 = lVar10 + 1;
    } while (nelem != lVar10);
  }
  lVar14 = (long)local_68 - local_78;
  local_68 = __s;
  pnga_access_ptr(local_a0,(Integer *)&local_78,(Integer *)&local_70,&local_88,&local_80);
  pnga_access_ptr(local_60,(Integer *)&local_78,(Integer *)&local_70,&local_90,&local_80);
  pnga_access_ptr(g_msk,(Integer *)&local_78,(Integer *)&local_70,&local_b0,&local_80);
  lVar5 = local_88;
  lVar13 = local_90;
  lVar10 = local_b0;
  lVar15 = local_50 * 0x11 + local_58;
  switch(local_58 + local_50 * 0x11) {
  case 0x4662:
    local_c8 = (ulong)local_c8._4_4_ << 0x20;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        if (*(int *)(lVar10 + 4 + lVar15 * 4) == 0) {
          uVar16 = (undefined4)local_c8;
        }
        else {
          uVar16 = *(undefined4 *)(lVar5 + 4 + lVar15 * 4);
          local_c8 = CONCAT44(local_c8._4_4_,uVar16);
        }
        *(undefined4 *)(lVar13 + 4 + lVar15 * 4) = uVar16;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4663:
    local_c8 = (ulong)local_c8._4_4_ << 0x20;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        if (*(long *)(lVar10 + 8 + lVar15 * 8) == 0) {
          uVar16 = (undefined4)local_c8;
        }
        else {
          uVar16 = *(undefined4 *)(lVar5 + 4 + lVar15 * 4);
          local_c8 = CONCAT44(local_c8._4_4_,uVar16);
        }
        *(undefined4 *)(lVar13 + 4 + lVar15 * 4) = uVar16;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4664:
    local_c8 = (ulong)local_c8._4_4_ << 0x20;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        fVar3 = *(float *)(lVar10 + 4 + lVar15 * 4);
        if ((fVar3 != 0.0) || (NAN(fVar3))) {
          uVar16 = *(undefined4 *)(lVar5 + 4 + lVar15 * 4);
          local_c8 = CONCAT44(local_c8._4_4_,uVar16);
        }
        else {
          uVar16 = (undefined4)local_c8;
        }
        *(undefined4 *)(lVar13 + 4 + lVar15 * 4) = uVar16;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4665:
    local_c8 = (ulong)local_c8._4_4_ << 0x20;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        dVar4 = *(double *)(lVar10 + 8 + lVar15 * 8);
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          uVar16 = *(undefined4 *)(lVar5 + 4 + lVar15 * 4);
          local_c8 = CONCAT44(local_c8._4_4_,uVar16);
        }
        else {
          uVar16 = (undefined4)local_c8;
        }
        *(undefined4 *)(lVar13 + 4 + lVar15 * 4) = uVar16;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4666:
  case 0x4669:
  case 0x466a:
  case 0x466b:
  case 0x466c:
  case 0x466d:
  case 0x466e:
  case 0x466f:
  case 0x4670:
  case 0x4672:
  case 0x4677:
  case 0x467a:
  case 0x467b:
  case 0x467c:
  case 0x467d:
  case 0x467e:
  case 0x467f:
  case 0x4680:
  case 0x4681:
  case 0x4683:
  case 0x4688:
  case 0x468b:
  case 0x468c:
  case 0x468d:
  case 0x468e:
  case 0x468f:
  case 0x4690:
  case 0x4691:
  case 0x4692:
  case 0x4694:
  case 0x4699:
  case 0x469c:
  case 0x469d:
  case 0x469e:
  case 0x469f:
  case 0x46a0:
  case 0x46a1:
  case 0x46a2:
  case 0x46a3:
switchD_001368bd_caseD_4666:
    pnga_error("ga_scan_copy:wrong data type",lVar15);
    break;
  case 0x4667:
    local_c8 = (ulong)local_c8._4_4_ << 0x20;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        fVar3 = *(float *)(lVar10 + 8 + lVar15 * 8);
        if (((fVar3 != 0.0) || (NAN(fVar3))) ||
           ((fVar3 = *(float *)(lVar10 + 0xc + lVar15 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
          uVar16 = *(undefined4 *)(lVar5 + 4 + lVar15 * 4);
          local_c8 = CONCAT44(local_c8._4_4_,uVar16);
        }
        else {
          uVar16 = (undefined4)local_c8;
        }
        *(undefined4 *)(lVar13 + 4 + lVar15 * 4) = uVar16;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4668:
    local_c8 = (ulong)local_c8._4_4_ << 0x20;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      pdVar9 = (double *)(uVar11 * 0x10 + local_78 * -0x10 + lVar10 + 8);
      do {
        if ((((pdVar9[-1] != 0.0) || (NAN(pdVar9[-1]))) || (*pdVar9 != 0.0)) || (NAN(*pdVar9))) {
          uVar16 = *(undefined4 *)(lVar5 + 4 + lVar15 * 4);
          local_c8 = CONCAT44(local_c8._4_4_,uVar16);
        }
        else {
          uVar16 = (undefined4)local_c8;
        }
        *(undefined4 *)(lVar13 + 4 + lVar15 * 4) = uVar16;
        lVar15 = lVar15 + 1;
        pdVar9 = pdVar9 + 2;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4671:
    local_c8 = (ulong)local_c8._4_4_ << 0x20;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        if (*(long *)(lVar10 + 8 + lVar15 * 8) == 0) {
          uVar16 = (undefined4)local_c8;
        }
        else {
          uVar16 = *(undefined4 *)(lVar5 + 4 + lVar15 * 4);
          local_c8 = CONCAT44(local_c8._4_4_,uVar16);
        }
        *(undefined4 *)(lVar13 + 4 + lVar15 * 4) = uVar16;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4673:
    local_c8 = 0;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        if (*(int *)(lVar10 + 4 + lVar15 * 4) != 0) {
          local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
        }
        *(long *)(lVar13 + 8 + lVar15 * 8) = local_c8;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4674:
    local_c8 = 0;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        if (*(long *)(lVar10 + 8 + lVar15 * 8) != 0) {
          local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
        }
        *(long *)(lVar13 + 8 + lVar15 * 8) = local_c8;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4675:
    local_c8 = 0;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        fVar3 = *(float *)(lVar10 + 4 + lVar15 * 4);
        if ((fVar3 != 0.0) || (NAN(fVar3))) {
          local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
        }
        *(long *)(lVar13 + 8 + lVar15 * 8) = local_c8;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4676:
    local_c8 = 0;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        dVar4 = *(double *)(lVar10 + 8 + lVar15 * 8);
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
        }
        *(long *)(lVar13 + 8 + lVar15 * 8) = local_c8;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4678:
    local_c8 = 0;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        fVar3 = *(float *)(lVar10 + 8 + lVar15 * 8);
        if (((fVar3 != 0.0) || (NAN(fVar3))) ||
           ((fVar3 = *(float *)(lVar10 + 0xc + lVar15 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
          local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
        }
        *(long *)(lVar13 + 8 + lVar15 * 8) = local_c8;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4679:
    local_c8 = 0;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      pdVar9 = (double *)(uVar11 * 0x10 + local_78 * -0x10 + lVar10 + 8);
      do {
        if ((((pdVar9[-1] != 0.0) || (NAN(pdVar9[-1]))) || (*pdVar9 != 0.0)) || (NAN(*pdVar9))) {
          local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
        }
        *(long *)(lVar13 + 8 + lVar15 * 8) = local_c8;
        lVar15 = lVar15 + 1;
        pdVar9 = pdVar9 + 2;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4682:
    local_c8 = 0;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        if (*(long *)(lVar10 + 8 + lVar15 * 8) != 0) {
          local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
        }
        *(long *)(lVar13 + 8 + lVar15 * 8) = local_c8;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4684:
    local_c8 = (ulong)local_c8._4_4_ << 0x20;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        if (*(int *)(lVar10 + 4 + lVar15 * 4) == 0) {
          uVar16 = (undefined4)local_c8;
        }
        else {
          uVar16 = *(undefined4 *)(lVar5 + 4 + lVar15 * 4);
          local_c8 = CONCAT44(local_c8._4_4_,uVar16);
        }
        *(undefined4 *)(lVar13 + 4 + lVar15 * 4) = uVar16;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4685:
    local_c8 = (ulong)local_c8._4_4_ << 0x20;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        if (*(long *)(lVar10 + 8 + lVar15 * 8) == 0) {
          uVar16 = (undefined4)local_c8;
        }
        else {
          uVar16 = *(undefined4 *)(lVar5 + 4 + lVar15 * 4);
          local_c8 = CONCAT44(local_c8._4_4_,uVar16);
        }
        *(undefined4 *)(lVar13 + 4 + lVar15 * 4) = uVar16;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4686:
    local_c8 = (ulong)local_c8._4_4_ << 0x20;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        fVar3 = *(float *)(lVar10 + 4 + lVar15 * 4);
        if ((fVar3 != 0.0) || (NAN(fVar3))) {
          uVar16 = *(undefined4 *)(lVar5 + 4 + lVar15 * 4);
          local_c8 = CONCAT44(local_c8._4_4_,uVar16);
        }
        else {
          uVar16 = (undefined4)local_c8;
        }
        *(undefined4 *)(lVar13 + 4 + lVar15 * 4) = uVar16;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4687:
    local_c8 = (ulong)local_c8._4_4_ << 0x20;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        dVar4 = *(double *)(lVar10 + 8 + lVar15 * 8);
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          uVar16 = *(undefined4 *)(lVar5 + 4 + lVar15 * 4);
          local_c8 = CONCAT44(local_c8._4_4_,uVar16);
        }
        else {
          uVar16 = (undefined4)local_c8;
        }
        *(undefined4 *)(lVar13 + 4 + lVar15 * 4) = uVar16;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4689:
    local_c8 = (ulong)local_c8._4_4_ << 0x20;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        fVar3 = *(float *)(lVar10 + 8 + lVar15 * 8);
        if (((fVar3 != 0.0) || (NAN(fVar3))) ||
           ((fVar3 = *(float *)(lVar10 + 0xc + lVar15 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
          uVar16 = *(undefined4 *)(lVar5 + 4 + lVar15 * 4);
          local_c8 = CONCAT44(local_c8._4_4_,uVar16);
        }
        else {
          uVar16 = (undefined4)local_c8;
        }
        *(undefined4 *)(lVar13 + 4 + lVar15 * 4) = uVar16;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x468a:
    local_c8 = (ulong)local_c8._4_4_ << 0x20;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      pdVar9 = (double *)(uVar11 * 0x10 + local_78 * -0x10 + lVar10 + 8);
      do {
        if ((((pdVar9[-1] != 0.0) || (NAN(pdVar9[-1]))) || (*pdVar9 != 0.0)) || (NAN(*pdVar9))) {
          uVar16 = *(undefined4 *)(lVar5 + 4 + lVar15 * 4);
          local_c8 = CONCAT44(local_c8._4_4_,uVar16);
        }
        else {
          uVar16 = (undefined4)local_c8;
        }
        *(undefined4 *)(lVar13 + 4 + lVar15 * 4) = uVar16;
        lVar15 = lVar15 + 1;
        pdVar9 = pdVar9 + 2;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4693:
    local_c8 = (ulong)local_c8._4_4_ << 0x20;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        if (*(long *)(lVar10 + 8 + lVar15 * 8) == 0) {
          uVar16 = (undefined4)local_c8;
        }
        else {
          uVar16 = *(undefined4 *)(lVar5 + 4 + lVar15 * 4);
          local_c8 = CONCAT44(local_c8._4_4_,uVar16);
        }
        *(undefined4 *)(lVar13 + 4 + lVar15 * 4) = uVar16;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4695:
    local_c8 = 0;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        if (*(int *)(lVar10 + 4 + lVar15 * 4) == 0) {
          uVar16 = (undefined4)local_c8;
          uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
        }
        else {
          local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
          uVar16 = (undefined4)local_c8;
          uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
        }
        *(ulong *)(lVar13 + 8 + lVar15 * 8) = CONCAT44(uVar17,uVar16);
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4696:
    local_c8 = 0;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        if (*(long *)(lVar10 + 8 + lVar15 * 8) == 0) {
          uVar16 = (undefined4)local_c8;
          uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
        }
        else {
          local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
          uVar16 = (undefined4)local_c8;
          uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
        }
        *(ulong *)(lVar13 + 8 + lVar15 * 8) = CONCAT44(uVar17,uVar16);
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4697:
    local_c8 = 0;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        fVar3 = *(float *)(lVar10 + 4 + lVar15 * 4);
        if ((fVar3 != 0.0) || (NAN(fVar3))) {
          local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
          uVar16 = (undefined4)local_c8;
          uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
        }
        else {
          uVar16 = (undefined4)local_c8;
          uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
        }
        *(ulong *)(lVar13 + 8 + lVar15 * 8) = CONCAT44(uVar17,uVar16);
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x4698:
    local_c8 = 0;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        dVar4 = *(double *)(lVar10 + 8 + lVar15 * 8);
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
          uVar16 = (undefined4)local_c8;
          uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
        }
        else {
          uVar16 = (undefined4)local_c8;
          uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
        }
        *(ulong *)(lVar13 + 8 + lVar15 * 8) = CONCAT44(uVar17,uVar16);
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x469a:
    local_c8 = 0;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        fVar3 = *(float *)(lVar10 + 8 + lVar15 * 8);
        if (((fVar3 != 0.0) || (NAN(fVar3))) ||
           ((fVar3 = *(float *)(lVar10 + 0xc + lVar15 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
          local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
          uVar16 = (undefined4)local_c8;
          uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
        }
        else {
          uVar16 = (undefined4)local_c8;
          uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
        }
        *(ulong *)(lVar13 + 8 + lVar15 * 8) = CONCAT44(uVar17,uVar16);
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x469b:
    local_c8 = 0;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      pdVar9 = (double *)(uVar11 * 0x10 + local_78 * -0x10 + lVar10 + 8);
      do {
        if ((((pdVar9[-1] != 0.0) || (NAN(pdVar9[-1]))) || (*pdVar9 != 0.0)) || (NAN(*pdVar9))) {
          local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
          uVar16 = (undefined4)local_c8;
          uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
        }
        else {
          uVar16 = (undefined4)local_c8;
          uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
        }
        *(ulong *)(lVar13 + 8 + lVar15 * 8) = CONCAT44(uVar17,uVar16);
        lVar15 = lVar15 + 1;
        pdVar9 = pdVar9 + 2;
      } while (lVar15 < lVar14);
    }
    break;
  case 0x46a4:
    local_c8 = 0;
    if (local_d0 != -1) {
      pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
    }
    if (local_a8 <= lVar14) {
      uVar11 = local_98;
      if ((long)local_98 < (long)local_78) {
        uVar11 = local_78;
      }
      lVar15 = ~local_78 + uVar11;
      do {
        if (*(long *)(lVar10 + 8 + lVar15 * 8) == 0) {
          uVar16 = (undefined4)local_c8;
          uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
        }
        else {
          local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
          uVar16 = (undefined4)local_c8;
          uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
        }
        *(ulong *)(lVar13 + 8 + lVar15 * 8) = CONCAT44(uVar17,uVar16);
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar14);
    }
    break;
  default:
    switch(lVar15) {
    case 0x46b7:
      local_c8 = 0;
      if (local_d0 != -1) {
        pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
      }
      if (local_a8 <= lVar14) {
        uVar11 = local_98;
        if ((long)local_98 < (long)local_78) {
          uVar11 = local_78;
        }
        lVar15 = ~local_78 + uVar11;
        do {
          if (*(int *)(lVar10 + 4 + lVar15 * 4) == 0) {
            uVar16 = (undefined4)local_c8;
            uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
          }
          else {
            local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
            uVar16 = (undefined4)local_c8;
            uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
          }
          *(ulong *)(lVar13 + 8 + lVar15 * 8) = CONCAT44(uVar17,uVar16);
          lVar15 = lVar15 + 1;
        } while (lVar15 < lVar14);
      }
      break;
    case 0x46b8:
      local_c8 = 0;
      if (local_d0 != -1) {
        pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
      }
      if (local_a8 <= lVar14) {
        uVar11 = local_98;
        if ((long)local_98 < (long)local_78) {
          uVar11 = local_78;
        }
        lVar15 = ~local_78 + uVar11;
        do {
          if (*(long *)(lVar10 + 8 + lVar15 * 8) == 0) {
            uVar16 = (undefined4)local_c8;
            uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
          }
          else {
            local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
            uVar16 = (undefined4)local_c8;
            uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
          }
          *(ulong *)(lVar13 + 8 + lVar15 * 8) = CONCAT44(uVar17,uVar16);
          lVar15 = lVar15 + 1;
        } while (lVar15 < lVar14);
      }
      break;
    case 0x46b9:
      local_c8 = 0;
      if (local_d0 != -1) {
        pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
      }
      if (local_a8 <= lVar14) {
        uVar11 = local_98;
        if ((long)local_98 < (long)local_78) {
          uVar11 = local_78;
        }
        lVar15 = ~local_78 + uVar11;
        do {
          fVar3 = *(float *)(lVar10 + 4 + lVar15 * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
            uVar16 = (undefined4)local_c8;
            uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
          }
          else {
            uVar16 = (undefined4)local_c8;
            uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
          }
          *(ulong *)(lVar13 + 8 + lVar15 * 8) = CONCAT44(uVar17,uVar16);
          lVar15 = lVar15 + 1;
        } while (lVar15 < lVar14);
      }
      break;
    case 0x46ba:
      local_c8 = 0;
      if (local_d0 != -1) {
        pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
      }
      if (local_a8 <= lVar14) {
        uVar11 = local_98;
        if ((long)local_98 < (long)local_78) {
          uVar11 = local_78;
        }
        lVar15 = ~local_78 + uVar11;
        do {
          dVar4 = *(double *)(lVar10 + 8 + lVar15 * 8);
          if ((dVar4 != 0.0) || (NAN(dVar4))) {
            local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
            uVar16 = (undefined4)local_c8;
            uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
          }
          else {
            uVar16 = (undefined4)local_c8;
            uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
          }
          *(ulong *)(lVar13 + 8 + lVar15 * 8) = CONCAT44(uVar17,uVar16);
          lVar15 = lVar15 + 1;
        } while (lVar15 < lVar14);
      }
      break;
    case 0x46bb:
    case 0x46be:
    case 0x46bf:
    case 0x46c0:
    case 0x46c1:
    case 0x46c2:
    case 0x46c3:
    case 0x46c4:
    case 0x46c5:
    case 0x46c7:
    case 0x46cc:
    case 0x46cf:
    case 0x46d0:
    case 0x46d1:
    case 0x46d2:
    case 0x46d3:
    case 0x46d4:
    case 0x46d5:
    case 0x46d6:
      goto switchD_001368bd_caseD_4666;
    case 0x46bc:
      local_c8 = 0;
      if (local_d0 != -1) {
        pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
      }
      if (local_a8 <= lVar14) {
        uVar11 = local_98;
        if ((long)local_98 < (long)local_78) {
          uVar11 = local_78;
        }
        lVar15 = ~local_78 + uVar11;
        do {
          fVar3 = *(float *)(lVar10 + 8 + lVar15 * 8);
          if (((fVar3 != 0.0) || (NAN(fVar3))) ||
             ((fVar3 = *(float *)(lVar10 + 0xc + lVar15 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
            local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
            uVar16 = (undefined4)local_c8;
            uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
          }
          else {
            uVar16 = (undefined4)local_c8;
            uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
          }
          *(ulong *)(lVar13 + 8 + lVar15 * 8) = CONCAT44(uVar17,uVar16);
          lVar15 = lVar15 + 1;
        } while (lVar15 < lVar14);
      }
      break;
    case 0x46bd:
      local_c8 = 0;
      if (local_d0 != -1) {
        pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
      }
      if (local_a8 <= lVar14) {
        uVar11 = local_98;
        if ((long)local_98 < (long)local_78) {
          uVar11 = local_78;
        }
        lVar15 = ~local_78 + uVar11;
        pdVar9 = (double *)(uVar11 * 0x10 + local_78 * -0x10 + lVar10 + 8);
        do {
          if ((((pdVar9[-1] != 0.0) || (NAN(pdVar9[-1]))) || (*pdVar9 != 0.0)) || (NAN(*pdVar9))) {
            local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
            uVar16 = (undefined4)local_c8;
            uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
          }
          else {
            uVar16 = (undefined4)local_c8;
            uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
          }
          *(ulong *)(lVar13 + 8 + lVar15 * 8) = CONCAT44(uVar17,uVar16);
          lVar15 = lVar15 + 1;
          pdVar9 = pdVar9 + 2;
        } while (lVar15 < lVar14);
      }
      break;
    case 0x46c6:
      local_c8 = 0;
      if (local_d0 != -1) {
        pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
      }
      if (local_a8 <= lVar14) {
        uVar11 = local_98;
        if ((long)local_98 < (long)local_78) {
          uVar11 = local_78;
        }
        lVar15 = ~local_78 + uVar11;
        do {
          if (*(long *)(lVar10 + 8 + lVar15 * 8) == 0) {
            uVar16 = (undefined4)local_c8;
            uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
          }
          else {
            local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
            uVar16 = (undefined4)local_c8;
            uVar17 = (undefined4)((ulong)local_c8 >> 0x20);
          }
          *(ulong *)(lVar13 + 8 + lVar15 * 8) = CONCAT44(uVar17,uVar16);
          lVar15 = lVar15 + 1;
        } while (lVar15 < lVar14);
      }
      break;
    case 0x46c8:
      local_c8 = 0;
      uStack_c0 = 0;
      if (local_d0 != -1) {
        pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
      }
      if (local_a8 <= lVar14) {
        uVar11 = local_98;
        if ((long)local_98 < (long)local_78) {
          uVar11 = local_78;
        }
        lVar15 = ~local_78 + uVar11;
        lVar12 = uVar11 * 0x10 + local_78 * -0x10;
        do {
          if (*(int *)(lVar10 + 4 + lVar15 * 4) == 0) {
            uVar16 = (undefined4)local_c8;
            uVar17 = local_c8._4_4_;
            uVar18 = (undefined4)uStack_c0;
            uVar19 = uStack_c0._4_4_;
          }
          else {
            plVar1 = (long *)(lVar5 + lVar12);
            local_c8 = *plVar1;
            uStack_c0 = plVar1[1];
            uVar16 = (int)*plVar1;
            uVar17 = *(undefined4 *)((long)plVar1 + 4);
            uVar18 = (int)plVar1[1];
            uVar19 = *(undefined4 *)((long)plVar1 + 0xc);
          }
          puVar2 = (undefined4 *)(lVar13 + lVar12);
          *puVar2 = uVar16;
          puVar2[1] = uVar17;
          puVar2[2] = uVar18;
          puVar2[3] = uVar19;
          lVar15 = lVar15 + 1;
          lVar12 = lVar12 + 0x10;
        } while (lVar15 < lVar14);
      }
      break;
    case 0x46c9:
      local_c8 = 0;
      uStack_c0 = 0;
      if (local_d0 != -1) {
        pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
      }
      if (local_a8 <= lVar14) {
        uVar11 = local_98;
        if ((long)local_98 < (long)local_78) {
          uVar11 = local_78;
        }
        lVar15 = ~local_78 + uVar11;
        lVar12 = uVar11 * 0x10 + local_78 * -0x10;
        do {
          if (*(long *)(lVar10 + 8 + lVar15 * 8) == 0) {
            uVar16 = (undefined4)local_c8;
            uVar17 = local_c8._4_4_;
            uVar18 = (undefined4)uStack_c0;
            uVar19 = uStack_c0._4_4_;
          }
          else {
            plVar1 = (long *)(lVar5 + lVar12);
            local_c8 = *plVar1;
            uStack_c0 = plVar1[1];
            uVar16 = (int)*plVar1;
            uVar17 = *(undefined4 *)((long)plVar1 + 4);
            uVar18 = (int)plVar1[1];
            uVar19 = *(undefined4 *)((long)plVar1 + 0xc);
          }
          puVar2 = (undefined4 *)(lVar13 + lVar12);
          *puVar2 = uVar16;
          puVar2[1] = uVar17;
          puVar2[2] = uVar18;
          puVar2[3] = uVar19;
          lVar15 = lVar15 + 1;
          lVar12 = lVar12 + 0x10;
        } while (lVar15 < lVar14);
      }
      break;
    case 0x46ca:
      local_c8 = 0;
      uStack_c0 = 0;
      if (local_d0 != -1) {
        pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
      }
      if (local_a8 <= lVar14) {
        uVar11 = local_98;
        if ((long)local_98 < (long)local_78) {
          uVar11 = local_78;
        }
        lVar15 = ~local_78 + uVar11;
        lVar12 = uVar11 * 0x10 + local_78 * -0x10;
        do {
          fVar3 = *(float *)(lVar10 + 4 + lVar15 * 4);
          if ((fVar3 != 0.0) || (NAN(fVar3))) {
            plVar1 = (long *)(lVar5 + lVar12);
            local_c8 = *plVar1;
            uStack_c0 = plVar1[1];
            uVar16 = (int)*plVar1;
            uVar17 = *(undefined4 *)((long)plVar1 + 4);
            uVar18 = (int)plVar1[1];
            uVar19 = *(undefined4 *)((long)plVar1 + 0xc);
          }
          else {
            uVar16 = (undefined4)local_c8;
            uVar17 = local_c8._4_4_;
            uVar18 = (undefined4)uStack_c0;
            uVar19 = uStack_c0._4_4_;
          }
          puVar2 = (undefined4 *)(lVar13 + lVar12);
          *puVar2 = uVar16;
          puVar2[1] = uVar17;
          puVar2[2] = uVar18;
          puVar2[3] = uVar19;
          lVar15 = lVar15 + 1;
          lVar12 = lVar12 + 0x10;
        } while (lVar15 < lVar14);
      }
      break;
    case 0x46cb:
      local_c8 = 0;
      uStack_c0 = 0;
      if (local_d0 != -1) {
        pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
      }
      if (local_a8 <= lVar14) {
        uVar11 = local_98;
        if ((long)local_98 < (long)local_78) {
          uVar11 = local_78;
        }
        lVar15 = ~local_78 + uVar11;
        lVar12 = uVar11 * 0x10 + local_78 * -0x10;
        do {
          dVar4 = *(double *)(lVar10 + 8 + lVar15 * 8);
          if ((dVar4 != 0.0) || (NAN(dVar4))) {
            plVar1 = (long *)(lVar5 + lVar12);
            local_c8 = *plVar1;
            uStack_c0 = plVar1[1];
            uVar16 = (int)*plVar1;
            uVar17 = *(undefined4 *)((long)plVar1 + 4);
            uVar18 = (int)plVar1[1];
            uVar19 = *(undefined4 *)((long)plVar1 + 0xc);
          }
          else {
            uVar16 = (undefined4)local_c8;
            uVar17 = local_c8._4_4_;
            uVar18 = (undefined4)uStack_c0;
            uVar19 = uStack_c0._4_4_;
          }
          puVar2 = (undefined4 *)(lVar13 + lVar12);
          *puVar2 = uVar16;
          puVar2[1] = uVar17;
          puVar2[2] = uVar18;
          puVar2[3] = uVar19;
          lVar15 = lVar15 + 1;
          lVar12 = lVar12 + 0x10;
        } while (lVar15 < lVar14);
      }
      break;
    case 0x46cd:
      local_c8 = 0;
      uStack_c0 = 0;
      if (local_d0 != -1) {
        pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
      }
      if (local_a8 <= lVar14) {
        uVar11 = local_98;
        if ((long)local_98 < (long)local_78) {
          uVar11 = local_78;
        }
        lVar15 = ~local_78 + uVar11;
        lVar12 = uVar11 * 0x10 + local_78 * -0x10;
        do {
          fVar3 = *(float *)(lVar10 + 8 + lVar15 * 8);
          if (((fVar3 != 0.0) || (NAN(fVar3))) ||
             ((fVar3 = *(float *)(lVar10 + 0xc + lVar15 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
            plVar1 = (long *)(lVar5 + lVar12);
            local_c8 = *plVar1;
            uStack_c0 = plVar1[1];
            uVar16 = (int)*plVar1;
            uVar17 = *(undefined4 *)((long)plVar1 + 4);
            uVar18 = (int)plVar1[1];
            uVar19 = *(undefined4 *)((long)plVar1 + 0xc);
          }
          else {
            uVar16 = (undefined4)local_c8;
            uVar17 = local_c8._4_4_;
            uVar18 = (undefined4)uStack_c0;
            uVar19 = uStack_c0._4_4_;
          }
          puVar2 = (undefined4 *)(lVar13 + lVar12);
          *puVar2 = uVar16;
          puVar2[1] = uVar17;
          puVar2[2] = uVar18;
          puVar2[3] = uVar19;
          lVar15 = lVar15 + 1;
          lVar12 = lVar12 + 0x10;
        } while (lVar15 < lVar14);
      }
      break;
    case 0x46ce:
      local_c8 = 0;
      uStack_c0 = 0;
      if (local_d0 != -1) {
        pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
      }
      if (local_a8 <= lVar14) {
        uVar11 = local_98;
        if ((long)local_98 < (long)local_78) {
          uVar11 = local_78;
        }
        lVar15 = ~local_78 + uVar11;
        lVar12 = uVar11 * 0x10 + local_78 * -0x10;
        do {
          if ((((*(double *)(lVar10 + lVar12) != 0.0) || (NAN(*(double *)(lVar10 + lVar12)))) ||
              (dVar4 = *(double *)(lVar10 + 8 + lVar12), dVar4 != 0.0)) || (NAN(dVar4))) {
            plVar1 = (long *)(lVar5 + lVar12);
            local_c8 = *plVar1;
            uStack_c0 = plVar1[1];
            uVar16 = (int)*plVar1;
            uVar17 = *(undefined4 *)((long)plVar1 + 4);
            uVar18 = (int)plVar1[1];
            uVar19 = *(undefined4 *)((long)plVar1 + 0xc);
          }
          else {
            uVar16 = (undefined4)local_c8;
            uVar17 = local_c8._4_4_;
            uVar18 = (undefined4)uStack_c0;
            uVar19 = uStack_c0._4_4_;
          }
          puVar2 = (undefined4 *)(lVar13 + lVar12);
          *puVar2 = uVar16;
          puVar2[1] = uVar17;
          puVar2[2] = uVar18;
          puVar2[3] = uVar19;
          lVar15 = lVar15 + 1;
          lVar12 = lVar12 + 0x10;
        } while (lVar15 < lVar14);
      }
      break;
    case 0x46d7:
      local_c8 = 0;
      uStack_c0 = 0;
      if (local_d0 != -1) {
        pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
      }
      if (local_a8 <= lVar14) {
        uVar11 = local_98;
        if ((long)local_98 < (long)local_78) {
          uVar11 = local_78;
        }
        lVar15 = ~local_78 + uVar11;
        lVar12 = uVar11 * 0x10 + local_78 * -0x10;
        do {
          if (*(long *)(lVar10 + 8 + lVar15 * 8) == 0) {
            uVar16 = (undefined4)local_c8;
            uVar17 = local_c8._4_4_;
            uVar18 = (undefined4)uStack_c0;
            uVar19 = uStack_c0._4_4_;
          }
          else {
            plVar1 = (long *)(lVar5 + lVar12);
            local_c8 = *plVar1;
            uStack_c0 = plVar1[1];
            uVar16 = (int)*plVar1;
            uVar17 = *(undefined4 *)((long)plVar1 + 4);
            uVar18 = (int)plVar1[1];
            uVar19 = *(undefined4 *)((long)plVar1 + 0xc);
          }
          puVar2 = (undefined4 *)(lVar13 + lVar12);
          *puVar2 = uVar16;
          puVar2[1] = uVar17;
          puVar2[2] = uVar18;
          puVar2[3] = uVar19;
          lVar15 = lVar15 + 1;
          lVar12 = lVar12 + 0x10;
        } while (lVar15 < lVar14);
      }
      break;
    default:
      switch(lVar15) {
      case 0x4761:
        local_c8 = 0;
        if (local_d0 != -1) {
          pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
        }
        if (local_a8 <= lVar14) {
          uVar11 = local_98;
          if ((long)local_98 < (long)local_78) {
            uVar11 = local_78;
          }
          lVar15 = ~local_78 + uVar11;
          do {
            if (*(int *)(lVar10 + 4 + lVar15 * 4) != 0) {
              local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
            }
            *(long *)(lVar13 + 8 + lVar15 * 8) = local_c8;
            lVar15 = lVar15 + 1;
          } while (lVar15 < lVar14);
        }
        break;
      case 0x4762:
        local_c8 = 0;
        if (local_d0 != -1) {
          pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
        }
        if (local_a8 <= lVar14) {
          uVar11 = local_98;
          if ((long)local_98 < (long)local_78) {
            uVar11 = local_78;
          }
          lVar15 = ~local_78 + uVar11;
          do {
            if (*(long *)(lVar10 + 8 + lVar15 * 8) != 0) {
              local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
            }
            *(long *)(lVar13 + 8 + lVar15 * 8) = local_c8;
            lVar15 = lVar15 + 1;
          } while (lVar15 < lVar14);
        }
        break;
      case 0x4763:
        local_c8 = 0;
        if (local_d0 != -1) {
          pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
        }
        if (local_a8 <= lVar14) {
          uVar11 = local_98;
          if ((long)local_98 < (long)local_78) {
            uVar11 = local_78;
          }
          lVar15 = ~local_78 + uVar11;
          do {
            fVar3 = *(float *)(lVar10 + 4 + lVar15 * 4);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
            }
            *(long *)(lVar13 + 8 + lVar15 * 8) = local_c8;
            lVar15 = lVar15 + 1;
          } while (lVar15 < lVar14);
        }
        break;
      case 0x4764:
        local_c8 = 0;
        if (local_d0 != -1) {
          pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
        }
        if (local_a8 <= lVar14) {
          uVar11 = local_98;
          if ((long)local_98 < (long)local_78) {
            uVar11 = local_78;
          }
          lVar15 = ~local_78 + uVar11;
          do {
            dVar4 = *(double *)(lVar10 + 8 + lVar15 * 8);
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
            }
            *(long *)(lVar13 + 8 + lVar15 * 8) = local_c8;
            lVar15 = lVar15 + 1;
          } while (lVar15 < lVar14);
        }
        break;
      default:
        goto switchD_001368bd_caseD_4666;
      case 0x4766:
        local_c8 = 0;
        if (local_d0 != -1) {
          pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
        }
        if (local_a8 <= lVar14) {
          uVar11 = local_98;
          if ((long)local_98 < (long)local_78) {
            uVar11 = local_78;
          }
          lVar15 = ~local_78 + uVar11;
          do {
            fVar3 = *(float *)(lVar10 + 8 + lVar15 * 8);
            if (((fVar3 != 0.0) || (NAN(fVar3))) ||
               ((fVar3 = *(float *)(lVar10 + 0xc + lVar15 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
              local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
            }
            *(long *)(lVar13 + 8 + lVar15 * 8) = local_c8;
            lVar15 = lVar15 + 1;
          } while (lVar15 < lVar14);
        }
        break;
      case 0x4767:
        local_c8 = 0;
        if (local_d0 != -1) {
          pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
        }
        if (local_a8 <= lVar14) {
          uVar11 = local_98;
          if ((long)local_98 < (long)local_78) {
            uVar11 = local_78;
          }
          lVar15 = ~local_78 + uVar11;
          pdVar9 = (double *)(uVar11 * 0x10 + local_78 * -0x10 + lVar10 + 8);
          do {
            if (((pdVar9[-1] != 0.0) || (NAN(pdVar9[-1]))) || ((*pdVar9 != 0.0 || (NAN(*pdVar9)))))
            {
              local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
            }
            *(long *)(lVar13 + 8 + lVar15 * 8) = local_c8;
            lVar15 = lVar15 + 1;
            pdVar9 = pdVar9 + 2;
          } while (lVar15 < lVar14);
        }
        break;
      case 0x4770:
        local_c8 = 0;
        if (local_d0 != -1) {
          pnga_get(local_a0,&local_d0,&local_d0,&local_c8,&local_80);
        }
        if (local_a8 <= lVar14) {
          uVar11 = local_98;
          if ((long)local_98 < (long)local_78) {
            uVar11 = local_78;
          }
          lVar15 = ~local_78 + uVar11;
          do {
            if (*(long *)(lVar10 + 8 + lVar15 * 8) != 0) {
              local_c8 = *(long *)(lVar5 + 8 + lVar15 * 8);
            }
            *(long *)(lVar13 + 8 + lVar15 * 8) = local_c8;
            lVar15 = lVar15 + 1;
          } while (lVar15 < lVar14);
        }
      }
    }
  }
  pnga_release(local_a0,(Integer *)&local_78,(Integer *)&local_70);
  pnga_release(g_msk,(Integer *)&local_78,(Integer *)&local_70);
  pnga_release_update(local_60,(Integer *)&local_78,(Integer *)&local_70);
  __s = local_68;
LAB_00138683:
  pnga_sync();
  pnga_free(__s);
  return;
}

Assistant:

void pnga_scan_copy(Integer g_src, Integer g_dst, Integer g_msk,
                           Integer lo, Integer hi)
{       
    long *lim=NULL;
    Integer i, nproc, me, elems, ioff, lop, hip, ndim, dims, ld;
    Integer type_src, type_dst, type_msk, combined_type;
    void *ptr_src=NULL;
    void *ptr_dst=NULL;
    void *ptr_msk=NULL;

    nproc = pnga_nnodes();
    me = pnga_nodeid();

    pnga_check_handle(g_src, "ga_scan_copy 1");
    pnga_check_handle(g_dst, "ga_scan_copy 2");
    pnga_check_handle(g_msk, "ga_scan_copy 3");

    if(!pnga_compare_distr(g_src, g_msk))
        pnga_error("ga_scan_copy: different distribution src",0);
    if(!pnga_compare_distr(g_dst, g_msk))
        pnga_error("ga_scan_copy: different distribution dst",0);

    pnga_inquire(g_src, &type_src, &ndim, &dims);
    pnga_inquire(g_dst, &type_dst, &ndim, &dims);
    pnga_inquire(g_msk, &type_msk, &ndim, &dims);
    if(ndim>1)pnga_error("ga_scan_copy: applicable to 1-dim arrays",ndim);
    if(g_src == g_dst) {
        pnga_error("ga_scan_copy: src and dst must be different arrays", 0);
    }
    if(type_src != type_dst) {
        pnga_error("ga_scan_copy: src and dst arrays must be same type", 0);
    }

    pnga_sync();

    pnga_distribution(g_msk, me, &lop, &hip);

    /* create arrays to hold last bit set on a given process */
    lim = (long *) pnga_malloc(nproc, MT_C_LONGINT, "ga scan buf");
    bzero(lim,sizeof(long)*nproc);
    lim[me] = -1;

    /* find last bit set on given process (store as global index) */
    if ( lop > 0 ){ /* we get 0 if no elements stored on this process */ 
        elems = hip - lop + 1;
        pnga_access_ptr(g_msk, &lop, &hip, &ptr_msk, &ld);
        switch (type_msk) {
#define TYPE_CASE(MT,T,AT)                                      \
            case MT:                                            \
                {                                               \
                    T * restrict buf = (T*)ptr_msk;             \
                    for(i=0; i<elems; i++) {                    \
                        if (neq_zero_##AT(buf[i])) {            \
                            ioff = i + lop;                     \
                            if (ioff >= lo && ioff <= hi) {     \
                                lim[me]= ioff;                  \
                            }                                   \
                        }                                       \
                    }                                           \
                    break;                                      \
                }
#include "types.xh"
#undef TYPE_CASE
        }
        pnga_release(g_msk, &lop, &hip);
    }
    pnga_gop(C_LONG,lim,nproc,"+");

    if(hi <lop || hip <lo) {
        /* we have no elements to update */
    }
    else {
        Integer rmt_idx, start, stop;

        if (lop < lo) {
            start = lo - lop;
        } else {
            start = 0;
        }
        if (hip > hi) {
            stop = hi-lop+1;
        } else {
            stop = hip-lop+1;
        }

        /* If start bit is not first local bit, find last remote bit.
         * We must scan the entire lim to find the next-highest index.
         * Otherwise, this algorithm won't work with restricted arrays? */
        rmt_idx = -1;
        for (i=0; i<nproc; i++) {
            if (-1 != lim[i] && lim[i] > rmt_idx && lim[i] < lop) {
                rmt_idx = lim[i];
            }
        }

        pnga_access_ptr(g_src, &lop, &hip, &ptr_src, &ld);
        pnga_access_ptr(g_dst, &lop, &hip, &ptr_dst, &ld);
        pnga_access_ptr(g_msk, &lop, &hip, &ptr_msk, &ld);
        combined_type = MT_NUMTYPES*type_src + type_msk;
        switch (combined_type) {
#define TYPE_CASE(MT,T,AT,MT_MSK,T_MSK,AT_MSK)                              \
            case (MT_NUMTYPES*MT) + MT_MSK:                                 \
                {                                                           \
                    T * restrict src = (T*)ptr_src;                         \
                    T * restrict dst = (T*)ptr_dst;                         \
                    T_MSK * restrict msk = (T_MSK*)ptr_msk;                 \
                    T last_val;                                             \
                    assign_zero_##AT(last_val);                             \
                    if (-1 != rmt_idx) {                                    \
                        pnga_get(g_src, &rmt_idx, &rmt_idx, &last_val, &ld);\
                    }                                                       \
                    for (i=start; i<stop; i++) {                            \
                        if (neq_zero_##AT_MSK(msk[i])) {                    \
                            assign_##AT(last_val, src[i]);                  \
                        }                                                   \
                        assign_##AT(dst[i], last_val);                      \
                    }                                                       \
                    break;                                                  \
                }
#include "types2.xh"
#undef TYPE_CASE
            default: pnga_error("ga_scan_copy:wrong data type",combined_type);
        }
        /* release local access to arrays */
        pnga_release(g_src, &lop, &hip);
        pnga_release(g_msk, &lop, &hip);
        pnga_release_update(g_dst, &lop, &hip);
    }

    pnga_sync();
    pnga_free(lim);
}